

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-dis.c
# Opt level: O0

easm_subinsn * dis_parse_subinsn(disctx *ctx,dis_status *status,int *spos)

{
  int iVar1;
  easm_subinsn *peVar2;
  easm_expr **ppeVar3;
  easm_expr *peVar4;
  easm_sinsn *peVar5;
  easm_subinsn *res;
  int *spos_local;
  dis_status *status_local;
  disctx *ctx_local;
  
  peVar2 = (easm_subinsn *)calloc(0x30,1);
  while (ctx->atoms[*spos]->type != LITEM_NAME) {
    if (peVar2->prefsmax <= peVar2->prefsnum) {
      if (peVar2->prefsmax == 0) {
        peVar2->prefsmax = 0x10;
      }
      else {
        peVar2->prefsmax = peVar2->prefsmax << 1;
      }
      ppeVar3 = (easm_expr **)realloc(peVar2->prefs,(long)peVar2->prefsmax << 3);
      peVar2->prefs = ppeVar3;
    }
    peVar4 = dis_parse_expr(ctx,status,spos);
    iVar1 = peVar2->prefsnum;
    peVar2->prefsnum = iVar1 + 1;
    peVar2->prefs[iVar1] = peVar4;
  }
  peVar5 = dis_parse_sinsn(ctx,status,spos);
  peVar2->sinsn = peVar5;
  return peVar2;
}

Assistant:

static struct easm_subinsn *dis_parse_subinsn(struct disctx *ctx, enum dis_status *status, int *spos) {
	struct easm_subinsn *res = calloc(sizeof *res, 1);
	while (ctx->atoms[*spos]->type != LITEM_NAME)
		ADDARRAY(res->prefs, dis_parse_expr(ctx, status, spos));
	res->sinsn = dis_parse_sinsn(ctx, status, spos);
	return res;
}